

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::DropDirectoryItem
          (cmComputeLinkInformation *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          )

{
  cmake *this_00;
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  this_00 = this->CMakeInstance;
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  local_90.first._M_len = 8;
  local_90.first._M_str = "Target \"";
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = (psVar1->_M_dataplus)._M_p;
  local_78 = psVar1->_M_string_length;
  local_68 = 0;
  local_60 = 0x21;
  local_58 = "\" requests linking to directory \"";
  local_50 = 0;
  local_40 = (item->Value)._M_dataplus._M_p;
  local_48 = (item->Value)._M_string_length;
  local_38 = 0;
  local_30 = 0x44;
  local_28 = "\".  Targets may link only to libraries.  CMake is dropping the item.";
  local_20 = 0;
  views._M_len = 5;
  views._M_array = &local_90;
  cmCatViews(&local_b0,views);
  cmake::IssueMessage(this_00,WARNING,&local_b0,&item->Backtrace);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(BT<std::string> const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  this->CMakeInstance->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Target \"", this->Target->GetName(),
             "\" requests linking to directory \"", item.Value,
             "\".  Targets may link only to libraries.  CMake is dropping "
             "the item."),
    item.Backtrace);
}